

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const*,char,unsigned_int&,char_const(&)[3],char_const*&>
          (String *__return_storage_ptr__,kj *this,char **params,char *params_1,uint *params_2,
          char (*params_3) [3],char **params_4)

{
  char **ppcVar1;
  char *value;
  kj *this_00;
  char (*value_00) [3];
  uint *value_01;
  String *params_4_00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  CappedArray<char,_14UL> local_68;
  char local_49 [1];
  ArrayPtr<const_char> local_48;
  char (*local_38) [3];
  char **params_local_4;
  char (*params_local_3) [3];
  uint *params_local_2;
  char *params_local_1;
  char **params_local;
  
  params_4_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char **)params_2;
  params_local_3 = (char (*) [3])params_1;
  params_local_2 = (uint *)params;
  params_local_1 = (char *)this;
  params_local = (char **)__return_storage_ptr__;
  ppcVar1 = fwd<char_const*>((NoInfer<const_char_*> *)this);
  local_48 = toCharSequence<char_const*>(ppcVar1);
  value = fwd<char>((NoInfer<char> *)params_local_2);
  local_49[0] = (char)toCharSequence<char>(value);
  this_00 = (kj *)fwd<unsigned_int&>((uint *)params_local_3);
  toCharSequence<unsigned_int&>(&local_68,this_00,value_01);
  value_00 = ::const((char (*) [3])params_local_4);
  local_78 = toCharSequence<char_const(&)[3]>(value_00);
  ppcVar1 = fwd<char_const*&>((char **)local_38);
  local_88 = toCharSequence<char_const*&>(ppcVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_4_00,(_ *)&local_48,(ArrayPtr<const_char> *)local_49,
             (FixedArray<char,_1UL> *)&local_68,(CappedArray<char,_14UL> *)&local_78,&local_88,
             (ArrayPtr<const_char> *)params_4_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}